

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O2

void __thiscall
Lib::
Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>::
~Recycled(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
          *this)

{
  _Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false> this_00;
  bool bVar1;
  Stack<std::unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>_>
  *this_01;
  _Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false> local_10;
  
  this_00._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
       .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
       _M_head_impl;
  if (&(this_00._M_head_impl)->super_RemovingMatcher<false> != (RemovingMatcher<false> *)0x0) {
    bVar1 = Indexing::CodeTree::RemovingMatcher<false>::keepRecycled
                      (&(this_00._M_head_impl)->super_RemovingMatcher<false>);
    if ((bVar1) &&
       (Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,Lib::NoReset,Lib::DefaultKeepRecycled>
        ::memAlive == '\x01')) {
      this_01 = mem();
      local_10._M_head_impl =
           (this->_self)._M_t.
           super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
           ._M_t.
           super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
           .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
           _M_head_impl;
      (this->_self)._M_t.
      super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>._M_head_impl
           = (RemovingLiteralMatcher *)0x0;
      Stack<std::unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>_>
      ::push(this_01,(unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                      *)&local_10);
      std::
      unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      ::~unique_ptr((unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                     *)&local_10);
    }
  }
  std::
  unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
  ::~unique_ptr(&this->_self);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }